

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Node * __thiscall Parser::test(Node *__return_storage_ptr__,Parser *this)

{
  lexemtype lVar1;
  Node *this_00;
  allocator local_1b9;
  string local_1b8;
  Node local_198;
  Node thisNode;
  Node local_118;
  Node local_d8;
  Node local_98;
  Node local_58;
  
  sum(__return_storage_ptr__,this);
  lVar1 = (this->lexer).lexem.type;
  if (lVar1 == MORE) {
    nextLexem(this);
    Node::Node(&thisNode,__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_1b8,"",&local_1b9);
    Node::Node(&local_198,COMPR,&local_1b8);
    Node::operator=(__return_storage_ptr__,&local_198);
    Node::~Node(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    Node::Node(&local_d8,&thisNode);
    std::vector<Node,_std::allocator<Node>_>::push_back(&__return_storage_ptr__->subnodes,&local_d8)
    ;
    Node::~Node(&local_d8);
    sum(&local_118,this);
    std::vector<Node,_std::allocator<Node>_>::push_back
              (&__return_storage_ptr__->subnodes,&local_118);
    this_00 = &local_118;
  }
  else {
    if (lVar1 != LESS) {
      return __return_storage_ptr__;
    }
    nextLexem(this);
    Node::Node(&thisNode,__return_storage_ptr__);
    std::__cxx11::string::string((string *)&local_1b8,"",&local_1b9);
    Node::Node(&local_198,COMPL,&local_1b8);
    Node::operator=(__return_storage_ptr__,&local_198);
    Node::~Node(&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    Node::Node(&local_58,&thisNode);
    std::vector<Node,_std::allocator<Node>_>::push_back(&__return_storage_ptr__->subnodes,&local_58)
    ;
    Node::~Node(&local_58);
    sum(&local_98,this);
    std::vector<Node,_std::allocator<Node>_>::push_back(&__return_storage_ptr__->subnodes,&local_98)
    ;
    this_00 = &local_98;
  }
  Node::~Node(this_00);
  Node::~Node(&thisNode);
  return __return_storage_ptr__;
}

Assistant:

Node Parser::test() { // todo make "compare" with operator
    Node testNode = sum();
    if (getLexemType() == LESS) {
        nextLexem();
        Node thisNode = Node(testNode);
        testNode = Node(COMPL);
        testNode.addSubnode(thisNode);
        testNode.addSubnode(sum());
    } else if (getLexemType() == MORE) {
        nextLexem();
        Node thisNode = Node(testNode);
        testNode = Node(COMPR);
        testNode.addSubnode(thisNode);
        testNode.addSubnode(sum());
    }
    return testNode;
}